

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall crsGA::Logger::Logger(Logger *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string local_78;
  DefaultFileLogHandler *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  LogHandlerPtr local_48;
  LogHandlerPtr local_38;
  
  this->_vptr_Logger = (_func_int **)&PTR__Logger_00112bb8;
  p_Var1 = &(this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->_logHandlersMap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_currentLogLevel = LOG_NOTICE;
  (this->_exit)._M_base._M_i = false;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->_queue)._data.c.
  super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_queue)._data.c.
  super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->_queue)._data.c.
  super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_queue)._data.c.
           super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_queue)._data.c.
           super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->_queue)._data.c.
           super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->_queue)._data.c.
  super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_queue)._data.c.
           super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->_queue)._data.c.
           super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->_queue)._data.c.
           super__Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>::
  _M_initialize_map((_Deque_base<crsGA::Logger::LogMessage,_std::allocator<crsGA::Logger::LogMessage>_>
                     *)&this->_queue,0);
  (this->_queue)._terminate = false;
  std::condition_variable::condition_variable(&(this->_queue)._data_cond);
  (this->_queue)._mtx.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_thread)._M_id._M_thread = 0;
  *(undefined8 *)((long)&(this->_queue)._mtx.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_queue)._mtx.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_queue)._mtx.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_queue)._mtx.super___mutex_base._M_mutex + 8) = 0;
  local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00112be8;
  local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__LogHandler_00112c38;
  paVar2 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"StandardOutputLogHandler","")
  ;
  addLogHandler(this,&local_48,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_58 = (DefaultFileLogHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<DefaultFileLogHandler,std::allocator<DefaultFileLogHandler>>
            (&_Stack_50,&local_58,(allocator<DefaultFileLogHandler> *)&local_78);
  local_38.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_58->super_LogHandler;
  local_38.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  local_58 = (DefaultFileLogHandler *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"DefaultFileLogHandler","");
  addLogHandler(this,&local_38,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_38.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  return;
}

Assistant:

Logger::Logger()
    : _logHandlersMap()
    , _currentLogLevel(LOG_NOTICE)
    , _exit(false)
    , _mutex()
    , _queue()
    , _thread()
{
    addLogHandler(std::make_shared<StandardOutputLogHandler>(), std::string("StandardOutputLogHandler"));
    addLogHandler(std::make_shared<DefaultFileLogHandler>(), std::string("DefaultFileLogHandler"));
}